

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl3.cpp
# Opt level: O2

void ImGui_ImplOpenGL3_RenderDrawData(ImDrawData *draw_data)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  GLsizei GVar4;
  int *piVar5;
  long lVar6;
  code *pcVar7;
  undefined1 auVar8 [16];
  GLvoid *pGVar9;
  float fb_height;
  GLboolean GVar10;
  GLboolean GVar11;
  GLboolean GVar12;
  GLboolean GVar13;
  undefined4 in_EAX;
  int iVar14;
  uint uVar15;
  PFNGLENABLEPROC *pp_Var16;
  long lVar17;
  int cmd_i;
  long lVar18;
  long lVar19;
  PFNGLENABLEPROC *pp_Var20;
  float fVar21;
  float fVar23;
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  float fVar26;
  GLuint vertex_array_object;
  int local_fc;
  GLenum last_blend_equation_alpha;
  GLenum last_blend_equation_rgb;
  GLenum last_blend_dst_alpha;
  GLenum last_blend_src_alpha;
  GLenum last_blend_dst_rgb;
  GLenum last_blend_src_rgb;
  GLint last_vertex_array_object;
  GLint last_array_buffer;
  GLint last_sampler;
  GLint last_texture;
  GLint last_program;
  GLenum last_active_texture;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  undefined8 uStack_b0;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  GLint last_polygon_mode [2];
  float local_78;
  float local_68;
  
  local_b8 = (float)(int)((float)*(undefined8 *)(draw_data + 0x2c) *
                         (float)*(undefined8 *)(draw_data + 0x24));
  fStack_b4 = (float)(int)((float)((ulong)*(undefined8 *)(draw_data + 0x2c) >> 0x20) *
                          (float)((ulong)*(undefined8 *)(draw_data + 0x24) >> 0x20));
  auVar22._0_4_ = -(uint)(0 < (int)local_b8);
  auVar22._4_4_ = -(uint)(0 < (int)local_b8);
  auVar22._8_4_ = -(uint)(0 < (int)fStack_b4);
  auVar22._12_4_ = -(uint)(0 < (int)fStack_b4);
  iVar14 = movmskpd(in_EAX,auVar22);
  if (iVar14 == 3) {
    uStack_b0 = 0;
    (*gl3wGetIntegerv)(0x84e0,(GLint *)&last_active_texture);
    (*gl3wActiveTexture)(0x84c0);
    (*gl3wGetIntegerv)(0x8b8d,&last_program);
    (*gl3wGetIntegerv)(0x8069,&last_texture);
    (*gl3wGetIntegerv)(0x8919,&last_sampler);
    (*gl3wGetIntegerv)(0x8894,&last_array_buffer);
    (*gl3wGetIntegerv)(0x85b5,&last_vertex_array_object);
    (*gl3wGetIntegerv)(0xb40,last_polygon_mode);
    (*gl3wGetIntegerv)(0xba2,last_viewport);
    (*gl3wGetIntegerv)(0xc10,last_scissor_box);
    (*gl3wGetIntegerv)(0x80c9,(GLint *)&last_blend_src_rgb);
    (*gl3wGetIntegerv)(0x80c8,(GLint *)&last_blend_dst_rgb);
    (*gl3wGetIntegerv)(0x80cb,(GLint *)&last_blend_src_alpha);
    (*gl3wGetIntegerv)(0x80ca,(GLint *)&last_blend_dst_alpha);
    (*gl3wGetIntegerv)(0x8009,(GLint *)&last_blend_equation_rgb);
    (*gl3wGetIntegerv)(0x883d,(GLint *)&last_blend_equation_alpha);
    GVar10 = (*gl3wIsEnabled)(0xbe2);
    GVar11 = (*gl3wIsEnabled)(0xb44);
    GVar12 = (*gl3wIsEnabled)(0xb71);
    GVar13 = (*gl3wIsEnabled)(0xc11);
    vertex_array_object = 0;
    (*gl3wGenVertexArrays)(1,&vertex_array_object);
    fb_height = fStack_b4;
    local_c8 = fStack_b4;
    fStack_c4 = fStack_b4;
    fStack_c0 = fStack_b4;
    fStack_bc = fStack_b4;
    local_fc = (int)local_b8;
    ImGui_ImplOpenGL3_SetupRenderState(draw_data,(int)local_b8,(int)fStack_b4,vertex_array_object);
    uVar1 = *(undefined8 *)(draw_data + 0x1c);
    uVar2 = *(undefined8 *)(draw_data + 0x2c);
    fVar25 = (float)((ulong)uVar2 >> 0x20);
    fVar23 = (float)((ulong)uVar1 >> 0x20);
    _local_b8 = CONCAT44((float)(int)fStack_b4,(float)(int)local_b8);
    uStack_b0 = CONCAT44((float)uStack_b0._4_4_,(float)(int)uStack_b0);
    local_c8 = (float)(int)local_c8;
    fStack_c4 = (float)(int)fStack_c4;
    fStack_c0 = (float)(int)fStack_c0;
    fStack_bc = (float)(int)fStack_bc;
    for (lVar17 = 0; lVar17 < *(int *)(draw_data + 0x10); lVar17 = lVar17 + 1) {
      piVar5 = *(int **)(*(long *)(draw_data + 8) + lVar17 * 8);
      (*gl3wBufferData)(0x8892,(long)piVar5[8] * 0x14,*(GLvoid **)(piVar5 + 10),0x88e0);
      (*gl3wBufferData)(0x8893,(long)piVar5[4] * 2,*(GLvoid **)(piVar5 + 6),0x88e0);
      lVar19 = 0;
      for (lVar18 = 0; lVar18 < *piVar5; lVar18 = lVar18 + 1) {
        lVar6 = *(long *)(piVar5 + 2);
        pcVar7 = *(code **)(lVar6 + 0x28 + lVar19);
        if (pcVar7 == (code *)0x0) {
          local_68 = (float)uVar1;
          local_78 = (float)uVar2;
          fVar21 = (*(float *)(lVar6 + lVar19) - local_68) * local_78;
          if ((fVar21 < local_b8) &&
             (fVar24 = (*(float *)(lVar6 + 4 + lVar19) - fVar23) * fVar25, fVar24 < local_c8)) {
            uVar3 = *(undefined8 *)(lVar6 + 8 + lVar19);
            local_78 = ((float)uVar3 - local_68) * local_78;
            fVar26 = ((float)((ulong)uVar3 >> 0x20) - fVar23) * fVar25;
            iVar14 = -(uint)(0.0 <= local_78);
            auVar8._4_4_ = iVar14;
            auVar8._0_4_ = iVar14;
            auVar8._8_4_ = -(uint)(0.0 <= fVar26);
            auVar8._12_4_ = -(uint)(0.0 <= fVar26);
            uVar15 = movmskpd(0,auVar8);
            if (((uVar15 & 1) != 0) && ((byte)((byte)uVar15 >> 1) != 0)) {
              (*gl3wScissor)((int)fVar21,(int)(local_c8 - fVar26),(int)(local_78 - fVar21),
                             (int)(fVar26 - fVar24));
              (*gl3wBindTexture)(0xde1,*(GLuint *)(lVar6 + 0x10 + lVar19));
              GVar4 = *(GLsizei *)(lVar6 + 0x20 + lVar19);
              pGVar9 = (GLvoid *)((ulong)*(uint *)(lVar6 + 0x1c + lVar19) * 2);
              if (g_GlVersion < 0xc80) {
                (*gl3wDrawElements)(4,GVar4,0x1403,pGVar9);
              }
              else {
                (*gl3wDrawElementsBaseVertex)
                          (4,GVar4,0x1403,pGVar9,*(GLint *)(lVar6 + 0x18 + lVar19));
              }
            }
          }
        }
        else if (pcVar7 == (code *)0xffffffffffffffff) {
          ImGui_ImplOpenGL3_SetupRenderState(draw_data,local_fc,(int)fb_height,vertex_array_object);
        }
        else {
          (*pcVar7)(piVar5,lVar6 + lVar19);
        }
        lVar19 = lVar19 + 0x38;
      }
    }
    (*gl3wDeleteVertexArrays)(1,&vertex_array_object);
    (*gl3wUseProgram)(last_program);
    (*gl3wBindTexture)(0xde1,last_texture);
    (*gl3wBindSampler)(0,last_sampler);
    (*gl3wActiveTexture)(last_active_texture);
    (*gl3wBindVertexArray)(last_vertex_array_object);
    (*gl3wBindBuffer)(0x8892,last_array_buffer);
    (*gl3wBlendEquationSeparate)(last_blend_equation_rgb,last_blend_equation_alpha);
    (*gl3wBlendFuncSeparate)
              (last_blend_src_rgb,last_blend_dst_rgb,last_blend_src_alpha,last_blend_dst_alpha);
    pp_Var20 = &gl3wEnable;
    pp_Var16 = &gl3wEnable;
    if (GVar10 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xbe2);
    pp_Var16 = &gl3wEnable;
    if (GVar11 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb44);
    pp_Var16 = &gl3wEnable;
    if (GVar12 == '\0') {
      pp_Var16 = &gl3wDisable;
    }
    (**pp_Var16)(0xb71);
    if (GVar13 == '\0') {
      pp_Var20 = &gl3wDisable;
    }
    (**pp_Var20)(0xc11);
    (*gl3wPolygonMode)(0x408,last_polygon_mode[0]);
    (*gl3wViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*gl3wScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
  }
  return;
}

Assistant:

void    ImGui_ImplOpenGL3_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width <= 0 || fb_height <= 0)
        return;

    // Backup GL state
    GLenum last_active_texture; glGetIntegerv(GL_ACTIVE_TEXTURE, (GLint*)&last_active_texture);
    glActiveTexture(GL_TEXTURE0);
    GLint last_program; glGetIntegerv(GL_CURRENT_PROGRAM, &last_program);
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
#ifdef GL_SAMPLER_BINDING
    GLint last_sampler; glGetIntegerv(GL_SAMPLER_BINDING, &last_sampler);
#endif
    GLint last_array_buffer; glGetIntegerv(GL_ARRAY_BUFFER_BINDING, &last_array_buffer);
#ifndef IMGUI_IMPL_OPENGL_ES2
    GLint last_vertex_array_object; glGetIntegerv(GL_VERTEX_ARRAY_BINDING, &last_vertex_array_object);
#endif
#ifdef GL_POLYGON_MODE
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
#endif
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLenum last_blend_src_rgb; glGetIntegerv(GL_BLEND_SRC_RGB, (GLint*)&last_blend_src_rgb);
    GLenum last_blend_dst_rgb; glGetIntegerv(GL_BLEND_DST_RGB, (GLint*)&last_blend_dst_rgb);
    GLenum last_blend_src_alpha; glGetIntegerv(GL_BLEND_SRC_ALPHA, (GLint*)&last_blend_src_alpha);
    GLenum last_blend_dst_alpha; glGetIntegerv(GL_BLEND_DST_ALPHA, (GLint*)&last_blend_dst_alpha);
    GLenum last_blend_equation_rgb; glGetIntegerv(GL_BLEND_EQUATION_RGB, (GLint*)&last_blend_equation_rgb);
    GLenum last_blend_equation_alpha; glGetIntegerv(GL_BLEND_EQUATION_ALPHA, (GLint*)&last_blend_equation_alpha);
    GLboolean last_enable_blend = glIsEnabled(GL_BLEND);
    GLboolean last_enable_cull_face = glIsEnabled(GL_CULL_FACE);
    GLboolean last_enable_depth_test = glIsEnabled(GL_DEPTH_TEST);
    GLboolean last_enable_scissor_test = glIsEnabled(GL_SCISSOR_TEST);
    bool clip_origin_lower_left = true;
#if defined(GL_CLIP_ORIGIN) && !defined(__APPLE__)
    GLenum last_clip_origin = 0; glGetIntegerv(GL_CLIP_ORIGIN, (GLint*)&last_clip_origin); // Support for GL 4.5's glClipControl(GL_UPPER_LEFT)
    if (last_clip_origin == GL_UPPER_LEFT)
        clip_origin_lower_left = false;
#endif

    // Setup desired GL state
    // Recreate the VAO every time (this is to easily allow multiple GL contexts to be rendered to. VAO are not shared among GL contexts)
    // The renderer would actually work without any VAO bound, but then our VertexAttrib calls would overwrite the default one currently bound.
    GLuint vertex_array_object = 0;
#ifndef IMGUI_IMPL_OPENGL_ES2
    glGenVertexArrays(1, &vertex_array_object);
#endif
    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];

        // Upload vertex/index buffers
        glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)cmd_list->VtxBuffer.Size * sizeof(ImDrawVert), (const GLvoid*)cmd_list->VtxBuffer.Data, GL_STREAM_DRAW);
        glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)cmd_list->IdxBuffer.Size * sizeof(ImDrawIdx), (const GLvoid*)cmd_list->IdxBuffer.Data, GL_STREAM_DRAW);

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback != NULL)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL3_SetupRenderState(draw_data, fb_width, fb_height, vertex_array_object);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    if (clip_origin_lower_left)
                        glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));
                    else
                        glScissor((int)clip_rect.x, (int)clip_rect.y, (int)clip_rect.z, (int)clip_rect.w); // Support for GL 4.5 rarely used glClipControl(GL_UPPER_LEFT)

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
#if IMGUI_IMPL_OPENGL_MAY_HAVE_VTX_OFFSET
                    if (g_GlVersion >= 3200)
                        glDrawElementsBaseVertex(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)), (GLint)pcmd->VtxOffset);
                    else
#endif
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, (void*)(intptr_t)(pcmd->IdxOffset * sizeof(ImDrawIdx)));
                }
            }
        }
    }

    // Destroy the temporary VAO
#ifndef IMGUI_IMPL_OPENGL_ES2
    glDeleteVertexArrays(1, &vertex_array_object);
#endif

    // Restore modified GL state
    glUseProgram(last_program);
    glBindTexture(GL_TEXTURE_2D, last_texture);
#ifdef GL_SAMPLER_BINDING
    glBindSampler(0, last_sampler);
#endif
    glActiveTexture(last_active_texture);
#ifndef IMGUI_IMPL_OPENGL_ES2
    glBindVertexArray(last_vertex_array_object);
#endif
    glBindBuffer(GL_ARRAY_BUFFER, last_array_buffer);
    glBlendEquationSeparate(last_blend_equation_rgb, last_blend_equation_alpha);
    glBlendFuncSeparate(last_blend_src_rgb, last_blend_dst_rgb, last_blend_src_alpha, last_blend_dst_alpha);
    if (last_enable_blend) glEnable(GL_BLEND); else glDisable(GL_BLEND);
    if (last_enable_cull_face) glEnable(GL_CULL_FACE); else glDisable(GL_CULL_FACE);
    if (last_enable_depth_test) glEnable(GL_DEPTH_TEST); else glDisable(GL_DEPTH_TEST);
    if (last_enable_scissor_test) glEnable(GL_SCISSOR_TEST); else glDisable(GL_SCISSOR_TEST);
#ifdef GL_POLYGON_MODE
    glPolygonMode(GL_FRONT_AND_BACK, (GLenum)last_polygon_mode[0]);
#endif
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
}